

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

uint __thiscall AmpIO::GetWriteNumBytes(AmpIO *this)

{
  uint32_t uVar1;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  return (this->NumMotors - (uint)(uVar1 < 8)) * 4 + 8;
}

Assistant:

unsigned int AmpIO::GetWriteNumBytes(void) const
{
    unsigned int numQuads;
    if (GetFirmwareVersion() < 8) {
        numQuads = NumMotors + 1;
    } else {
        numQuads = NumMotors + 2;
    }
    return numQuads * sizeof(quadlet_t);
}